

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int send_begin(SESSION_INSTANCE *session_instance)

{
  int iVar1;
  undefined8 in_RAX;
  BEGIN_HANDLE begin;
  AMQP_VALUE performative;
  int iVar2;
  uint16_t remote_channel;
  uint16_t local_22;
  
  local_22 = (uint16_t)((ulong)in_RAX >> 0x30);
  begin = begin_create(session_instance->next_outgoing_id,session_instance->incoming_window,
                       session_instance->outgoing_window);
  if (begin == (BEGIN_HANDLE)0x0) {
    return 0xe4;
  }
  iVar1 = begin_set_handle_max(begin,session_instance->handle_max);
  iVar2 = 0xeb;
  if (iVar1 == 0) {
    if (session_instance->session_state == SESSION_STATE_BEGIN_RCVD) {
      iVar1 = connection_endpoint_get_incoming_channel(session_instance->endpoint,&local_22);
      iVar2 = 0xf1;
      if ((iVar1 != 0) || (iVar1 = begin_set_remote_channel(begin,local_22), iVar1 != 0))
      goto LAB_00119d4d;
    }
    performative = amqpvalue_create_begin(begin);
    if (performative == (AMQP_VALUE)0x0) {
      iVar2 = 0xf8;
    }
    else {
      iVar1 = connection_encode_frame
                        (session_instance->endpoint,performative,(PAYLOAD *)0x0,0,
                         (ON_SEND_COMPLETE)0x0,(void *)0x0);
      iVar2 = 0xfe;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(performative);
    }
  }
LAB_00119d4d:
  begin_destroy(begin);
  return iVar2;
}

Assistant:

static int send_begin(SESSION_INSTANCE* session_instance)
{
    int result;
    BEGIN_HANDLE begin = begin_create(session_instance->next_outgoing_id, session_instance->incoming_window, session_instance->outgoing_window);

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint16_t remote_channel;
        if (begin_set_handle_max(begin, session_instance->handle_max) != 0)
        {
            result = MU_FAILURE;
        }
        else if ((session_instance->session_state == SESSION_STATE_BEGIN_RCVD) &&
            ((connection_endpoint_get_incoming_channel(session_instance->endpoint, &remote_channel) != 0) ||
            (begin_set_remote_channel(begin, remote_channel) != 0)))
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE begin_performative_value = amqpvalue_create_begin(begin);
            if (begin_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (connection_encode_frame(session_instance->endpoint, begin_performative_value, NULL, 0, NULL, NULL) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(begin_performative_value);
            }
        }

        begin_destroy(begin);
    }

    return result;
}